

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265_stream.cpp
# Opt level: O3

void h265_read_sps_rbsp(h265_stream_t *h,bs_t *b)

{
  byte *pbVar1;
  h265_sps_t *sps;
  videoinfo_t *pvVar2;
  uint32_t r_2;
  uint uVar3;
  byte *pbVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint32_t r_1;
  uint uVar10;
  uint uVar11;
  uint32_t r_4;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  uint32_t r;
  uint uVar22;
  long lVar23;
  bool bVar24;
  bool bVar25;
  uint8_t uVar26;
  profile_tier_level_t profile_tier_level;
  profile_tier_level_t local_2c0;
  
  local_2c0.sub_layer_level_present_flag.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2c0.sub_layer_level_present_flag.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2c0.sub_layer_profile_present_flag.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2c0.sub_layer_level_present_flag.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2c0.sub_layer_profile_present_flag.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2c0.sub_layer_profile_present_flag.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar22 = 0;
  memset(&local_2c0.sub_layer_profile_space,0,0x210);
  pbVar4 = b->p;
  pbVar1 = b->end;
  uVar9 = b->bits_left;
  iVar5 = 3;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    uVar10 = 0;
    if (pbVar4 < pbVar1) {
      uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar22 = uVar22 | uVar10 << ((byte)iVar5 & 0x1f);
    bVar24 = iVar5 != 0;
    iVar5 = iVar5 + -1;
  } while (bVar24);
  uVar10 = 0;
  iVar5 = 2;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    uVar3 = 0;
    if (pbVar4 < pbVar1) {
      uVar3 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar10 = uVar10 | uVar3 << ((byte)iVar5 & 0x1f);
    bVar24 = iVar5 != 0;
    iVar5 = iVar5 + -1;
  } while (bVar24);
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  if (pbVar4 < pbVar1) {
    bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
  }
  else {
    bVar24 = false;
  }
  if (uVar9 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  iVar5 = 0;
  memset(&local_2c0,0,0x290);
  h265_read_ptl(&local_2c0,b,1,uVar10);
  pbVar4 = b->p;
  pbVar1 = b->end;
  uVar9 = b->bits_left;
  uVar3 = 0xffffffff;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar25 = true;
    if (pbVar4 < pbVar1) {
      bVar25 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar5 = iVar5 + -1;
  } while (((bool)(bVar25 & uVar3 < 0x20)) && (pbVar4 < pbVar1));
  iVar20 = 0;
  uVar3 = 0;
  if (iVar5 != -1) {
    iVar6 = -2 - iVar5;
    iVar13 = -3 - iVar5;
    uVar3 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar18 = 0;
      if (pbVar4 < pbVar1) {
        uVar18 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar3 = uVar3 | uVar18 << ((byte)iVar6 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar13 != -2);
  }
  uVar18 = 0xffffffff;
  iVar5 = ~(-1 << (~(byte)iVar5 & 0x1f)) + uVar3;
  sps = h->sps_table[iVar5];
  h->sps = sps;
  memset(sps,0,0x1ef8);
  sps->sps_video_parameter_set_id = (uint8_t)uVar22;
  sps->sps_max_sub_layers_minus1 = (uint8_t)uVar10;
  sps->sps_temporal_id_nesting_flag = bVar24;
  memcpy(&sps->ptl,&local_2c0,0x290);
  sps->sps_seq_parameter_set_id = iVar5;
  pbVar4 = b->p;
  pbVar1 = b->end;
  uVar9 = b->bits_left;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar24 = true;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar18 = uVar18 + 1;
    iVar20 = iVar20 + -1;
  } while (((bool)(bVar24 & uVar18 < 0x20)) && (pbVar4 < pbVar1));
  iVar5 = -2;
  if (iVar20 == -1) {
    uVar22 = 0;
  }
  else {
    iVar6 = -2 - iVar20;
    iVar13 = -3 - iVar20;
    uVar22 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar3 = 0;
      if (pbVar4 < pbVar1) {
        uVar3 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar3 << ((byte)iVar6 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar13 != -2);
  }
  uVar3 = 0xffffffff;
  iVar20 = ~(-1 << (~(byte)iVar20 & 0x1f)) + uVar22;
  sps->chroma_format_idc = iVar20;
  pvVar2 = h->info;
  pvVar2->chroma_format_idc = iVar20;
  if (iVar20 == 3) {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    sps->separate_colour_plane_flag = bVar24;
    iVar5 = -1 - (uint)(bVar24 == false);
  }
  iVar6 = 0;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar24 = true;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar24 & uVar3 < 0x20)) && (pbVar4 < pbVar1));
  iVar13 = 0;
  if (iVar6 == -1) {
    uVar22 = 0;
  }
  else {
    iVar7 = -2 - iVar6;
    iVar15 = -3 - iVar6;
    uVar22 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar3 = 0;
      if (pbVar4 < pbVar1) {
        uVar3 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar3 << ((byte)iVar7 & 0x1f);
      iVar15 = iVar15 + -1;
      iVar7 = iVar7 + -1;
    } while (iVar15 != -2);
  }
  uVar3 = 0xffffffff;
  iVar6 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar22;
  sps->pic_width_in_luma_samples = iVar6;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar24 = true;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar13 = iVar13 + -1;
  } while (((bool)(bVar24 & uVar3 < 0x20)) && (pbVar4 < pbVar1));
  uVar22 = 0;
  if (iVar13 == -1) {
    uVar3 = 0;
  }
  else {
    iVar7 = -2 - iVar13;
    iVar15 = -3 - iVar13;
    uVar3 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar18 = 0;
      if (pbVar4 < pbVar1) {
        uVar18 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar3 = uVar3 | uVar18 << ((byte)iVar7 & 0x1f);
      iVar15 = iVar15 + -1;
      iVar7 = iVar7 + -1;
    } while (iVar15 != -2);
  }
  iVar13 = ~(-1 << (~(byte)iVar13 & 0x1f)) + uVar3;
  sps->pic_height_in_luma_samples = iVar13;
  pvVar2->width = iVar6;
  pvVar2->height = iVar13;
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  if (pbVar4 < pbVar1) {
    uVar22 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
  }
  if (uVar9 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    b->bits_left = 8;
    uVar9 = 8;
  }
  sps->conformance_window_flag = uVar22;
  if (uVar22 != 0) {
    uVar22 = 0xffffffff;
    iVar7 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar24 = true;
      if (pbVar4 < pbVar1) {
        bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 + 1;
      iVar7 = iVar7 + -1;
    } while (((bool)(bVar24 & uVar22 < 0x20)) && (pbVar4 < pbVar1));
    iVar15 = 0;
    if (iVar7 == -1) {
      uVar22 = 0;
    }
    else {
      iVar8 = -2 - iVar7;
      iVar16 = -3 - iVar7;
      uVar22 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar3 = 0;
        if (pbVar4 < pbVar1) {
          uVar3 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar22 = uVar22 | uVar3 << ((byte)iVar8 & 0x1f);
        iVar16 = iVar16 + -1;
        iVar8 = iVar8 + -1;
      } while (iVar16 != -2);
    }
    uVar3 = 0xffffffff;
    iVar7 = ~(-1 << (~(byte)iVar7 & 0x1f)) + uVar22;
    sps->conf_win_left_offset = iVar7;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar24 = true;
      if (pbVar4 < pbVar1) {
        bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar3 = uVar3 + 1;
      iVar15 = iVar15 + -1;
    } while (((bool)(bVar24 & uVar3 < 0x20)) && (pbVar4 < pbVar1));
    iVar8 = 0;
    if (iVar15 == -1) {
      uVar22 = 0;
    }
    else {
      iVar16 = -2 - iVar15;
      iVar17 = -3 - iVar15;
      uVar22 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar3 = 0;
        if (pbVar4 < pbVar1) {
          uVar3 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar22 = uVar22 | uVar3 << ((byte)iVar16 & 0x1f);
        iVar17 = iVar17 + -1;
        iVar16 = iVar16 + -1;
      } while (iVar17 != -2);
    }
    uVar3 = 0xffffffff;
    iVar15 = ~(-1 << (~(byte)iVar15 & 0x1f)) + uVar22;
    sps->conf_win_right_offset = iVar15;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar24 = true;
      if (pbVar4 < pbVar1) {
        bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar3 = uVar3 + 1;
      iVar8 = iVar8 + -1;
    } while (((bool)(bVar24 & uVar3 < 0x20)) && (pbVar4 < pbVar1));
    iVar16 = 0;
    if (iVar8 == -1) {
      uVar22 = 0;
    }
    else {
      iVar17 = -2 - iVar8;
      iVar14 = -3 - iVar8;
      uVar22 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar3 = 0;
        if (pbVar4 < pbVar1) {
          uVar3 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar22 = uVar22 | uVar3 << ((byte)iVar17 & 0x1f);
        iVar14 = iVar14 + -1;
        iVar17 = iVar17 + -1;
      } while (iVar14 != -2);
    }
    uVar3 = 0xffffffff;
    iVar8 = ~(-1 << (~(byte)iVar8 & 0x1f)) + uVar22;
    sps->conf_win_top_offset = iVar8;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar24 = true;
      if (pbVar4 < pbVar1) {
        bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar3 = uVar3 + 1;
      iVar16 = iVar16 + -1;
    } while (((bool)(bVar24 & uVar3 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar16 == -1) {
      uVar22 = 0;
    }
    else {
      iVar17 = -2 - iVar16;
      iVar14 = -3 - iVar16;
      uVar22 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar3 = 0;
        if (pbVar4 < pbVar1) {
          uVar3 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar22 = uVar22 | uVar3 << ((byte)iVar17 & 0x1f);
        iVar14 = iVar14 + -1;
        iVar17 = iVar17 + -1;
      } while (iVar14 != -2);
    }
    iVar17 = ~(-1 << (~(byte)iVar16 & 0x1f)) + uVar22;
    sps->conf_win_bottom_offset = iVar17;
    pvVar2->crop_left = iVar7;
    pvVar2->crop_right = iVar15;
    pvVar2->crop_top = iVar8;
    iVar16 = -1;
    if (iVar20 - 1U < 2) {
      iVar16 = iVar5;
    }
    pvVar2->crop_bottom = iVar17;
    iVar14 = -1;
    if (iVar20 == 1) {
      iVar14 = iVar5;
    }
    pvVar2->width = (iVar15 + iVar7) * iVar16 + iVar6;
    pvVar2->height = (iVar17 + iVar8) * iVar14 + iVar13;
  }
  uVar22 = 0xffffffff;
  iVar5 = 0;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar24 = true;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar22 = uVar22 + 1;
    iVar5 = iVar5 + -1;
  } while (((bool)(bVar24 & uVar22 < 0x20)) && (pbVar4 < pbVar1));
  iVar20 = 0;
  if (iVar5 == -1) {
    uVar22 = 0;
  }
  else {
    iVar6 = -2 - iVar5;
    iVar13 = -3 - iVar5;
    uVar22 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar3 = 0;
      if (pbVar4 < pbVar1) {
        uVar3 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar3 << ((byte)iVar6 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar13 != -2);
  }
  uVar3 = 0xffffffff;
  iVar5 = ~(-1 << (~(byte)iVar5 & 0x1f)) + uVar22;
  sps->bit_depth_luma_minus8 = iVar5;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar24 = true;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar20 = iVar20 + -1;
  } while (((bool)(bVar24 & uVar3 < 0x20)) && (pbVar4 < pbVar1));
  iVar6 = 0;
  if (iVar20 == -1) {
    uVar22 = 0;
  }
  else {
    iVar13 = -2 - iVar20;
    iVar7 = -3 - iVar20;
    uVar22 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar3 = 0;
      if (pbVar4 < pbVar1) {
        uVar3 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar3 << ((byte)iVar13 & 0x1f);
      iVar7 = iVar7 + -1;
      iVar13 = iVar13 + -1;
    } while (iVar7 != -2);
  }
  uVar3 = 0xffffffff;
  uVar18 = ~(-1 << (~(byte)iVar20 & 0x1f));
  sps->bit_depth_chroma_minus8 = uVar22 + uVar18;
  pvVar2->bit_depth_luma = iVar5 + 8;
  pvVar2->bit_depth_chroma = uVar22 + uVar18 + 8;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar24 = true;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar3 = uVar3 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar24 & uVar3 < 0x20)) && (pbVar4 < pbVar1));
  bVar24 = false;
  if (iVar6 == -1) {
    uVar22 = 0;
  }
  else {
    iVar5 = -2 - iVar6;
    iVar20 = -3 - iVar6;
    uVar22 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar3 = 0;
      if (pbVar4 < pbVar1) {
        uVar3 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar3 << ((byte)iVar5 & 0x1f);
      iVar20 = iVar20 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar20 != -2);
  }
  sps->log2_max_pic_order_cnt_lsb_minus4 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar22;
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  if (pbVar4 < pbVar1) {
    bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
  }
  if (uVar9 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    b->bits_left = 8;
  }
  sps->sps_sub_layer_ordering_info_present_flag = bVar24;
  uVar9 = 0;
  if (!bVar24) {
    uVar9 = uVar10 & 0xff;
  }
  uVar12 = (ulong)uVar9;
  do {
    uVar22 = b->bits_left;
    uVar9 = 0xffffffff;
    iVar5 = -2;
    do {
      iVar20 = iVar5;
      uVar3 = uVar9;
      uVar22 = uVar22 - 1;
      b->bits_left = uVar22;
      bVar24 = true;
      if (pbVar4 < pbVar1) {
        bVar24 = (*pbVar4 >> (uVar22 & 0x1f) & 1) == 0;
      }
      if (uVar22 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar22 = 8;
      }
      uVar9 = uVar3 + 1;
    } while (((bool)(bVar24 & uVar9 < 0x20)) && (iVar5 = iVar20 + 1, pbVar4 < pbVar1));
    uVar18 = 0;
    if (uVar9 != 0) {
      do {
        uVar22 = uVar22 - 1;
        b->bits_left = uVar22;
        uVar11 = 0;
        if (pbVar4 < pbVar1) {
          uVar11 = (uint)((*pbVar4 >> (uVar22 & 0x1f) & 1) != 0);
        }
        if (uVar22 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar22 = 8;
        }
        uVar18 = uVar18 | uVar11 << ((byte)uVar3 & 0x1f);
        uVar3 = uVar3 - 1;
        iVar20 = iVar20 + -1;
      } while (iVar20 != -2);
    }
    sps->sps_max_dec_pic_buffering_minus1[uVar12] = ~(-1 << ((byte)uVar9 & 0x1f)) + uVar18;
    uVar9 = b->bits_left;
    uVar22 = 0xffffffff;
    iVar5 = -2;
    do {
      iVar20 = iVar5;
      uVar3 = uVar22;
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar24 = true;
      if (pbVar4 < pbVar1) {
        bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar3 + 1;
    } while (((bool)(bVar24 & uVar22 < 0x20)) && (iVar5 = iVar20 + 1, pbVar4 < pbVar1));
    uVar18 = 0;
    if (uVar22 != 0) {
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar11 = 0;
        if (pbVar4 < pbVar1) {
          uVar11 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar18 = uVar18 | uVar11 << ((byte)uVar3 & 0x1f);
        uVar3 = uVar3 - 1;
        iVar20 = iVar20 + -1;
      } while (iVar20 != -2);
    }
    sps->sps_max_num_reorder_pics[uVar12] = ~(-1 << ((byte)uVar22 & 0x1f)) + uVar18;
    uVar22 = b->bits_left;
    uVar9 = 0xffffffff;
    iVar5 = -2;
    do {
      iVar20 = iVar5;
      uVar3 = uVar9;
      uVar22 = uVar22 - 1;
      b->bits_left = uVar22;
      bVar24 = true;
      if (pbVar4 < pbVar1) {
        bVar24 = (*pbVar4 >> (uVar22 & 0x1f) & 1) == 0;
      }
      if (uVar22 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar22 = 8;
      }
      uVar9 = uVar3 + 1;
    } while (((bool)(bVar24 & uVar9 < 0x20)) && (iVar5 = iVar20 + 1, pbVar4 < pbVar1));
    uVar18 = 0;
    if (uVar9 != 0) {
      do {
        uVar22 = uVar22 - 1;
        b->bits_left = uVar22;
        uVar11 = 0;
        if (pbVar4 < pbVar1) {
          uVar11 = (uint)((*pbVar4 >> (uVar22 & 0x1f) & 1) != 0);
        }
        if (uVar22 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar22 = 8;
        }
        uVar18 = uVar18 | uVar11 << ((byte)uVar3 & 0x1f);
        uVar3 = uVar3 - 1;
        iVar20 = iVar20 + -1;
      } while (iVar20 != -2);
    }
    sps->sps_max_latency_increase_plus1[uVar12] = ~(-1 << ((byte)uVar9 & 0x1f)) + uVar18;
    uVar12 = uVar12 + 1;
  } while (uVar12 != (uVar10 & 0xff) + 1);
  uVar9 = b->bits_left;
  pbVar4 = b->p;
  uVar22 = 0xffffffff;
  iVar5 = 0;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar24 = true;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar22 = uVar22 + 1;
    iVar5 = iVar5 + -1;
  } while (((bool)(bVar24 & uVar22 < 0x20)) && (pbVar4 < pbVar1));
  iVar20 = 0;
  if (iVar5 == -1) {
    uVar22 = 0;
  }
  else {
    iVar6 = -2 - iVar5;
    iVar13 = -3 - iVar5;
    uVar22 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar10 = 0;
      if (pbVar4 < pbVar1) {
        uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar10 << ((byte)iVar6 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar13 != -2);
  }
  uVar10 = 0xffffffff;
  sps->log2_min_luma_coding_block_size_minus3 = ~(-1 << (~(byte)iVar5 & 0x1f)) + uVar22;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar24 = true;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar10 = uVar10 + 1;
    iVar20 = iVar20 + -1;
  } while (((bool)(bVar24 & uVar10 < 0x20)) && (pbVar4 < pbVar1));
  iVar5 = 0;
  if (iVar20 == -1) {
    uVar22 = 0;
  }
  else {
    iVar6 = -2 - iVar20;
    iVar13 = -3 - iVar20;
    uVar22 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar10 = 0;
      if (pbVar4 < pbVar1) {
        uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar10 << ((byte)iVar6 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar13 != -2);
  }
  uVar10 = 0xffffffff;
  sps->log2_diff_max_min_luma_coding_block_size = ~(-1 << (~(byte)iVar20 & 0x1f)) + uVar22;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar24 = true;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar10 = uVar10 + 1;
    iVar5 = iVar5 + -1;
  } while (((bool)(bVar24 & uVar10 < 0x20)) && (pbVar4 < pbVar1));
  iVar20 = 0;
  if (iVar5 == -1) {
    uVar22 = 0;
  }
  else {
    iVar6 = -2 - iVar5;
    iVar13 = -3 - iVar5;
    uVar22 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar10 = 0;
      if (pbVar4 < pbVar1) {
        uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar10 << ((byte)iVar6 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar13 != -2);
    pbVar4 = b->p;
  }
  uVar10 = 0xffffffff;
  sps->log2_min_luma_transform_block_size_minus2 = ~(-1 << (~(byte)iVar5 & 0x1f)) + uVar22;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar24 = true;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar10 = uVar10 + 1;
    iVar20 = iVar20 + -1;
  } while (((bool)(bVar24 & uVar10 < 0x20)) && (pbVar4 < pbVar1));
  iVar5 = 0;
  if (iVar20 == -1) {
    uVar22 = 0;
  }
  else {
    iVar6 = -2 - iVar20;
    iVar13 = -3 - iVar20;
    uVar22 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar10 = 0;
      if (pbVar4 < pbVar1) {
        uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar10 << ((byte)iVar6 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar13 != -2);
  }
  uVar10 = 0xffffffff;
  sps->log2_diff_max_min_luma_transform_block_size = ~(-1 << (~(byte)iVar20 & 0x1f)) + uVar22;
  pbVar4 = b->p;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar24 = true;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar10 = uVar10 + 1;
    iVar5 = iVar5 + -1;
  } while (((bool)(bVar24 & uVar10 < 0x20)) && (pbVar4 < pbVar1));
  iVar20 = 0;
  if (iVar5 == -1) {
    uVar22 = 0;
  }
  else {
    iVar6 = -2 - iVar5;
    iVar13 = -3 - iVar5;
    uVar22 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar10 = 0;
      if (pbVar4 < pbVar1) {
        uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar10 << ((byte)iVar6 & 0x1f);
      iVar13 = iVar13 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar13 != -2);
  }
  uVar10 = 0xffffffff;
  sps->max_transform_hierarchy_depth_inter = ~(-1 << (~(byte)iVar5 & 0x1f)) + uVar22;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar24 = true;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar10 = uVar10 + 1;
    iVar20 = iVar20 + -1;
  } while (((bool)(bVar24 & uVar10 < 0x20)) && (pbVar4 < pbVar1));
  bVar24 = false;
  if (iVar20 == -1) {
    uVar22 = 0;
  }
  else {
    iVar5 = -2 - iVar20;
    iVar6 = -3 - iVar20;
    uVar22 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar10 = 0;
      if (pbVar4 < pbVar1) {
        uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar10 << ((byte)iVar5 & 0x1f);
      iVar6 = iVar6 + -1;
      iVar5 = iVar5 + -1;
    } while (iVar6 != -2);
  }
  sps->max_transform_hierarchy_depth_intra = ~(-1 << (~(byte)iVar20 & 0x1f)) + uVar22;
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  if (pbVar4 < pbVar1) {
    bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
  }
  if (uVar9 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    b->bits_left = 8;
    uVar9 = 8;
  }
  sps->scaling_list_enabled_flag = bVar24;
  if (bVar24) {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    uVar22 = 0;
    if (pbVar4 < b->end) {
      uVar22 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    sps->sps_scaling_list_data_present_flag = uVar22;
    if (uVar22 != 0) {
      h265_read_scaling_list(&sps->scaling_list_data,b);
      uVar9 = b->bits_left;
      pbVar4 = b->p;
    }
  }
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  pbVar1 = b->end;
  if (pbVar4 < pbVar1) {
    bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
  }
  else {
    bVar24 = false;
  }
  if (uVar9 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    b->bits_left = 8;
    uVar9 = 8;
  }
  sps->amp_enabled_flag = bVar24;
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  if (pbVar4 < pbVar1) {
    bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
  }
  else {
    bVar24 = false;
  }
  if (uVar9 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    b->bits_left = 8;
    uVar9 = 8;
  }
  sps->sample_adaptive_offset_enabled_flag = bVar24;
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  bVar24 = false;
  if (pbVar4 < pbVar1) {
    bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
  }
  if (uVar9 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    b->bits_left = 8;
    uVar9 = 8;
  }
  sps->pcm_enabled_flag = bVar24;
  if (bVar24) {
    uVar22 = 0;
    iVar5 = 3;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar10 = 0;
      if (pbVar4 < pbVar1) {
        uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar10 << ((byte)iVar5 & 0x1f);
      bVar24 = iVar5 != 0;
      iVar5 = iVar5 + -1;
    } while (bVar24);
    sps->pcm_sample_bit_depth_luma_minus1 = (uint8_t)uVar22;
    uVar22 = 0;
    iVar5 = 3;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar10 = 0;
      if (pbVar4 < pbVar1) {
        uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar10 << ((byte)iVar5 & 0x1f);
      bVar24 = iVar5 != 0;
      iVar5 = iVar5 + -1;
    } while (bVar24);
    sps->pcm_sample_bit_depth_chroma_minus1 = (uint8_t)uVar22;
    uVar22 = 0xffffffff;
    iVar5 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar24 = true;
      if (pbVar4 < pbVar1) {
        bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 + 1;
      iVar5 = iVar5 + -1;
    } while (((bool)(bVar24 & uVar22 < 0x20)) && (pbVar4 < pbVar1));
    iVar20 = 0;
    if (iVar5 == -1) {
      uVar22 = 0;
    }
    else {
      iVar6 = -2 - iVar5;
      iVar13 = -3 - iVar5;
      uVar22 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar10 = 0;
        if (pbVar4 < pbVar1) {
          uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar22 = uVar22 | uVar10 << ((byte)iVar6 & 0x1f);
        iVar13 = iVar13 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar13 != -2);
    }
    uVar10 = 0xffffffff;
    sps->log2_min_pcm_luma_coding_block_size_minus3 = ~(-1 << (~(byte)iVar5 & 0x1f)) + uVar22;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar24 = true;
      if (pbVar4 < pbVar1) {
        bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar10 = uVar10 + 1;
      iVar20 = iVar20 + -1;
    } while (((bool)(bVar24 & uVar10 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar20 == -1) {
      uVar22 = 0;
    }
    else {
      iVar5 = -2 - iVar20;
      iVar6 = -3 - iVar20;
      uVar22 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar10 = 0;
        if (pbVar4 < pbVar1) {
          uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar22 = uVar22 | uVar10 << ((byte)iVar5 & 0x1f);
        iVar6 = iVar6 + -1;
        iVar5 = iVar5 + -1;
      } while (iVar6 != -2);
    }
    sps->log2_diff_max_min_pcm_luma_coding_block_size = ~(-1 << (~(byte)iVar20 & 0x1f)) + uVar22;
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    sps->pcm_loop_filter_disabled_flag = bVar24;
  }
  uVar22 = 0xffffffff;
  iVar5 = 0;
  do {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    bVar24 = true;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    uVar22 = uVar22 + 1;
    iVar5 = iVar5 + -1;
  } while (((bool)(bVar24 & uVar22 < 0x20)) && (pbVar4 < pbVar1));
  if (iVar5 == -1) {
    uVar22 = 0;
  }
  else {
    iVar20 = -2 - iVar5;
    iVar6 = -3 - iVar5;
    uVar22 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar10 = 0;
      if (pbVar4 < pbVar1) {
        uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar10 << ((byte)iVar20 & 0x1f);
      iVar6 = iVar6 + -1;
      iVar20 = iVar20 + -1;
    } while (iVar6 != -2);
  }
  iVar5 = ~(-1 << (~(byte)iVar5 & 0x1f)) + uVar22;
  sps->num_short_term_ref_pic_sets = iVar5;
  std::vector<st_ref_pic_set_t,_std::allocator<st_ref_pic_set_t>_>::resize
            (&sps->st_ref_pic_set,(long)iVar5);
  std::vector<referencePictureSets_t,_std::allocator<referencePictureSets_t>_>::resize
            (&sps->m_RPSList,(long)sps->num_short_term_ref_pic_sets);
  if (0 < sps->num_short_term_ref_pic_sets) {
    lVar23 = 0;
    lVar21 = 0;
    lVar19 = 0;
    do {
      h265_read_short_term_ref_pic_set
                (b,sps,(st_ref_pic_set_t *)(*(long *)&sps->st_ref_pic_set + lVar21),
                 (referencePictureSets_t *)(*(long *)&sps->m_RPSList + lVar23),(int)lVar19);
      lVar19 = lVar19 + 1;
      lVar21 = lVar21 + 0xa8;
      lVar23 = lVar23 + 0x224;
    } while (lVar19 < sps->num_short_term_ref_pic_sets);
  }
  uVar9 = b->bits_left - 1;
  b->bits_left = uVar9;
  pbVar4 = b->p;
  pbVar1 = b->end;
  bVar24 = false;
  if (pbVar4 < pbVar1) {
    bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
  }
  if (uVar9 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    b->bits_left = 8;
    uVar9 = 8;
  }
  sps->long_term_ref_pics_present_flag = bVar24;
  if (bVar24) {
    uVar22 = 0xffffffff;
    iVar5 = 0;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      bVar24 = true;
      if (pbVar4 < pbVar1) {
        bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) == 0;
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 + 1;
      iVar5 = iVar5 + -1;
    } while (((bool)(bVar24 & uVar22 < 0x20)) && (pbVar4 < pbVar1));
    if (iVar5 == -1) {
      uVar22 = 0;
    }
    else {
      iVar20 = -2 - iVar5;
      iVar6 = -3 - iVar5;
      uVar22 = 0;
      do {
        uVar9 = uVar9 - 1;
        b->bits_left = uVar9;
        uVar10 = 0;
        if (pbVar4 < pbVar1) {
          uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
        }
        if (uVar9 == 0) {
          pbVar4 = pbVar4 + 1;
          b->p = pbVar4;
          b->bits_left = 8;
          uVar9 = 8;
        }
        uVar22 = uVar22 | uVar10 << ((byte)iVar20 & 0x1f);
        iVar6 = iVar6 + -1;
        iVar20 = iVar20 + -1;
      } while (iVar6 != -2);
    }
    iVar5 = ~(-1 << (~(byte)iVar5 & 0x1f)) + uVar22;
    sps->num_long_term_ref_pics_sps = iVar5;
    std::vector<int,_std::allocator<int>_>::resize(&sps->lt_ref_pic_poc_lsb_sps,(long)iVar5);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&sps->used_by_curr_pic_lt_sps_flag,(long)sps->num_long_term_ref_pics_sps);
    if (0 < sps->num_long_term_ref_pics_sps) {
      lVar19 = 0;
      do {
        iVar5 = sps->log2_max_pic_order_cnt_lsb_minus4;
        sps->lt_ref_pic_poc_lsb_sps_bytes = iVar5 + 4;
        pbVar4 = b->p;
        pbVar1 = b->end;
        if (iVar5 < -3) {
          uVar9 = 0;
        }
        else {
          uVar22 = b->bits_left;
          iVar5 = iVar5 + 3;
          uVar9 = 0;
          do {
            uVar22 = uVar22 - 1;
            b->bits_left = uVar22;
            uVar10 = 0;
            if (pbVar4 < pbVar1) {
              uVar10 = (uint)((*pbVar4 >> (uVar22 & 0x1f) & 1) != 0);
            }
            if (uVar22 == 0) {
              pbVar4 = pbVar4 + 1;
              b->p = pbVar4;
              b->bits_left = 8;
              uVar22 = 8;
            }
            uVar9 = uVar9 | uVar10 << ((byte)iVar5 & 0x1f);
            bVar24 = iVar5 != 0;
            iVar5 = iVar5 + -1;
          } while (bVar24);
        }
        (sps->lt_ref_pic_poc_lsb_sps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar19] = uVar9;
        uVar9 = b->bits_left - 1;
        b->bits_left = uVar9;
        if (pbVar4 < pbVar1) {
          bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
        }
        else {
          bVar24 = false;
        }
        if (uVar9 == 0) {
          b->p = pbVar4 + 1;
          b->bits_left = 8;
        }
        (sps->used_by_curr_pic_lt_sps_flag).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[lVar19] = bVar24;
        lVar19 = lVar19 + 1;
      } while (lVar19 < sps->num_long_term_ref_pics_sps);
    }
  }
  uVar9 = b->bits_left - 1;
  b->bits_left = uVar9;
  pbVar4 = b->p;
  pbVar1 = b->end;
  if (pbVar4 < pbVar1) {
    bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
  }
  else {
    bVar24 = false;
  }
  if (uVar9 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    b->bits_left = 8;
    uVar9 = 8;
  }
  sps->sps_temporal_mvp_enabled_flag = bVar24;
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  if (pbVar4 < pbVar1) {
    bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
  }
  else {
    bVar24 = false;
  }
  if (uVar9 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    b->bits_left = 8;
    uVar9 = 8;
  }
  sps->strong_intra_smoothing_enabled_flag = bVar24;
  uVar9 = uVar9 - 1;
  b->bits_left = uVar9;
  bVar24 = false;
  if (pbVar4 < pbVar1) {
    bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
  }
  if (uVar9 == 0) {
    b->p = pbVar4 + 1;
    b->bits_left = 8;
  }
  sps->vui_parameters_present_flag = bVar24;
  if (bVar24) {
    h265_read_vui_parameters(&sps->vui,b,(uint)sps->sps_max_sub_layers_minus1);
    uVar9 = (sps->vui).vui_num_units_in_tick;
    if (uVar9 != 0) {
      h->info->max_framerate = (float)(sps->vui).vui_time_scale / (float)uVar9;
    }
  }
  uVar9 = b->bits_left - 1;
  b->bits_left = uVar9;
  pbVar4 = b->p;
  pbVar1 = b->end;
  bVar24 = false;
  if (pbVar4 < pbVar1) {
    bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
  }
  if (uVar9 == 0) {
    pbVar4 = pbVar4 + 1;
    b->p = pbVar4;
    b->bits_left = 8;
    uVar9 = 8;
  }
  sps->sps_extension_present_flag = bVar24;
  if (bVar24) {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      uVar26 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      uVar26 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    sps->sps_range_extension_flag = uVar26;
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    sps->sps_multilayer_extension_flag = bVar24;
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    sps->sps_3d_extension_flag = bVar24;
    uVar22 = 0;
    iVar5 = 4;
    do {
      uVar9 = uVar9 - 1;
      b->bits_left = uVar9;
      uVar10 = 0;
      if (pbVar4 < pbVar1) {
        uVar10 = (uint)((*pbVar4 >> (uVar9 & 0x1f) & 1) != 0);
      }
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        b->bits_left = 8;
        uVar9 = 8;
      }
      uVar22 = uVar22 | uVar10 << ((byte)iVar5 & 0x1f);
      bVar24 = iVar5 != 0;
      iVar5 = iVar5 + -1;
    } while (bVar24);
    sps->sps_extension_5bits = (uint8_t)uVar22;
  }
  else {
    uVar26 = sps->sps_range_extension_flag;
  }
  if (uVar26 != '\0') {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    (sps->sps_range_extension).transform_skip_rotation_enabled_flag = bVar24;
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    (sps->sps_range_extension).transform_skip_context_enabled_flag = bVar24;
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    (sps->sps_range_extension).implicit_rdpcm_enabled_flag = bVar24;
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    (sps->sps_range_extension).explicit_rdpcm_enabled_flag = bVar24;
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    (sps->sps_range_extension).extended_precision_processing_flag = bVar24;
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    (sps->sps_range_extension).intra_smoothing_disabled_flag = bVar24;
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    (sps->sps_range_extension).high_precision_offsets_enabled_flag = bVar24;
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    (sps->sps_range_extension).persistent_rice_adaptation_enabled_flag = bVar24;
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    (sps->sps_range_extension).cabac_bypass_alignment_enabled_flag = bVar24;
  }
  if (sps->sps_multilayer_extension_flag != '\0') {
    uVar9 = uVar9 - 1;
    b->bits_left = uVar9;
    if (pbVar4 < pbVar1) {
      bVar24 = (*pbVar4 >> (uVar9 & 0x1f) & 1) != 0;
    }
    else {
      bVar24 = false;
    }
    if (uVar9 == 0) {
      pbVar4 = pbVar4 + 1;
      b->p = pbVar4;
      b->bits_left = 8;
      uVar9 = 8;
    }
    sps->inter_view_mv_vert_constraint_flag = bVar24;
  }
  if ((sps->sps_extension_5bits != '\0') && (pbVar4 < pbVar1)) {
    do {
      uVar9 = uVar9 - 1;
      if (uVar9 == 0) {
        pbVar4 = pbVar4 + 1;
        b->p = pbVar4;
        uVar9 = 8;
      }
    } while (pbVar4 < pbVar1);
    b->bits_left = uVar9;
  }
  h265_read_rbsp_trailing_bits(b);
  profile_tier_level_t::~profile_tier_level_t(&local_2c0);
  return;
}

Assistant:

void  h265_read_sps_rbsp(h265_stream_t* h, bs_t* b)
{
    // NOTE 不能直接赋值给sps，因为还未知是哪一个sps。

    int sps_video_parameter_set_id = 0;
    int sps_max_sub_layers_minus1 = 0;
    int sps_temporal_id_nesting_flag = 0;
    int sps_seq_parameter_set_id = 0;
    profile_tier_level_t profile_tier_level;

    sps_video_parameter_set_id = bs_read_u(b, 4);
    sps_max_sub_layers_minus1 = bs_read_u(b, 3);
    sps_temporal_id_nesting_flag = bs_read_u1(b);

    // profile tier level...
    memset(&profile_tier_level, '\0', sizeof(profile_tier_level_t));

    h265_read_ptl(&profile_tier_level, b, 1, sps_max_sub_layers_minus1);

    sps_seq_parameter_set_id = bs_read_ue(b);
    // 选择正确的sps表
    h->sps = h->sps_table[sps_seq_parameter_set_id];
    h265_sps_t* sps = h->sps;
    memset(sps, 0, sizeof(h265_sps_t));

    sps->sps_video_parameter_set_id   = sps_video_parameter_set_id;
    sps->sps_max_sub_layers_minus1    = sps_max_sub_layers_minus1;
    sps->sps_temporal_id_nesting_flag = sps_temporal_id_nesting_flag;

    memcpy(&(sps->ptl), &profile_tier_level, sizeof(profile_tier_level_t)); // ptl

    sps->sps_seq_parameter_set_id     = sps_seq_parameter_set_id;
    sps->chroma_format_idc     = bs_read_ue(b);
    h->info->chroma_format_idc = sps->chroma_format_idc;
    if (sps->chroma_format_idc == 3)
    {
        sps->separate_colour_plane_flag = bs_read_u1(b);
    }
    sps->pic_width_in_luma_samples  = bs_read_ue(b);
    sps->pic_height_in_luma_samples = bs_read_ue(b);

    h->info->width  = sps->pic_width_in_luma_samples;
    h->info->height = sps->pic_height_in_luma_samples;

    sps->conformance_window_flag    = bs_read_u1(b);
    if (sps->conformance_window_flag)
    {
        sps->conf_win_left_offset   = bs_read_ue(b);
        sps->conf_win_right_offset  = bs_read_ue(b);
        sps->conf_win_top_offset    = bs_read_ue(b);
        sps->conf_win_bottom_offset = bs_read_ue(b);

        // calc width & height again...
        h->info->crop_left = sps->conf_win_left_offset;
        h->info->crop_right = sps->conf_win_right_offset;
        h->info->crop_top = sps->conf_win_top_offset;
        h->info->crop_bottom = sps->conf_win_bottom_offset;

        // 根据Table6-1及7.4.3.2.1重新计算宽、高
        // 注意：手册里加1，实际上不用
        // 参考：https://github.com/mbunkus/mkvtoolnix/issues/1152
        int sub_width_c  = ((1 == sps->chroma_format_idc) || (2 == sps->chroma_format_idc)) && (0 == sps->separate_colour_plane_flag) ? 2 : 1;
        int sub_height_c =  (1 == sps->chroma_format_idc)                                  && (0 == sps->separate_colour_plane_flag) ? 2 : 1;
        h->info->width  -= (sub_width_c*sps->conf_win_right_offset + sub_width_c*sps->conf_win_left_offset);
        h->info->height -= (sub_height_c*sps->conf_win_bottom_offset + sub_height_c*sps->conf_win_top_offset);
    }

    sps->bit_depth_luma_minus8   = bs_read_ue(b);
    sps->bit_depth_chroma_minus8 = bs_read_ue(b);

    // bit depth
    h->info->bit_depth_luma = sps->bit_depth_luma_minus8 + 8;
    h->info->bit_depth_chroma = sps->bit_depth_chroma_minus8 + 8;

    sps->log2_max_pic_order_cnt_lsb_minus4 = bs_read_ue(b);

    sps->sps_sub_layer_ordering_info_present_flag = bs_read_u1(b);
    for (int i = (sps->sps_sub_layer_ordering_info_present_flag ? 0 : sps->sps_max_sub_layers_minus1);
         i <= sps->sps_max_sub_layers_minus1; i++ )
    {
        sps->sps_max_dec_pic_buffering_minus1[i] = bs_read_ue(b);
        sps->sps_max_num_reorder_pics[i]         = bs_read_ue(b);
        sps->sps_max_latency_increase_plus1[i]   = bs_read_ue(b);
    }

    sps->log2_min_luma_coding_block_size_minus3      = bs_read_ue(b);
    sps->log2_diff_max_min_luma_coding_block_size    = bs_read_ue(b);
    sps->log2_min_luma_transform_block_size_minus2   = bs_read_ue(b);
    sps->log2_diff_max_min_luma_transform_block_size = bs_read_ue(b);
    sps->max_transform_hierarchy_depth_inter         = bs_read_ue(b);
    sps->max_transform_hierarchy_depth_intra         = bs_read_ue(b);

    sps->scaling_list_enabled_flag = bs_read_u1(b);
    if (sps->scaling_list_enabled_flag)
    {
        sps->sps_scaling_list_data_present_flag = bs_read_u1(b);
        if (sps->sps_scaling_list_data_present_flag)
        {
            // scaling_list_data()
            h265_read_scaling_list(&(sps->scaling_list_data), b);
        }
    }

    sps->amp_enabled_flag = bs_read_u1(b);
    sps->sample_adaptive_offset_enabled_flag = bs_read_u1(b);
    sps->pcm_enabled_flag = bs_read_u1(b);
    if (sps->pcm_enabled_flag)
    {
        sps->pcm_sample_bit_depth_luma_minus1   = bs_read_u(b, 4);
        sps->pcm_sample_bit_depth_chroma_minus1 = bs_read_u(b, 4);
        sps->log2_min_pcm_luma_coding_block_size_minus3   = bs_read_ue(b);
        sps->log2_diff_max_min_pcm_luma_coding_block_size = bs_read_ue(b);
        sps->pcm_loop_filter_disabled_flag      = bs_read_u1(b);
    }

    sps->num_short_term_ref_pic_sets = bs_read_ue(b);
    // 根据num_short_term_ref_pic_sets创建数组
    sps->st_ref_pic_set.resize(sps->num_short_term_ref_pic_sets);
    sps->m_RPSList.resize(sps->num_short_term_ref_pic_sets); // 确定一共有多少个RPS列表
    referencePictureSets_t* rps = NULL;
    st_ref_pic_set_t* st = NULL;
    for (int i = 0; i < sps->num_short_term_ref_pic_sets; i++)
    {
        st = &sps->st_ref_pic_set[i];
        rps = &sps->m_RPSList[i];
        h265_read_short_term_ref_pic_set(b, sps, st, rps, i);
    }

    sps->long_term_ref_pics_present_flag = bs_read_u1(b);
    if (sps->long_term_ref_pics_present_flag)
    {
        sps->num_long_term_ref_pics_sps = bs_read_ue(b);
        sps->lt_ref_pic_poc_lsb_sps.resize(sps->num_long_term_ref_pics_sps);
        sps->used_by_curr_pic_lt_sps_flag.resize(sps->num_long_term_ref_pics_sps);
        for (int i = 0; i < sps->num_long_term_ref_pics_sps; i++)
        {
            sps->lt_ref_pic_poc_lsb_sps_bytes = sps->log2_max_pic_order_cnt_lsb_minus4 + 4;
            sps->lt_ref_pic_poc_lsb_sps[i] = bs_read_u(b, sps->log2_max_pic_order_cnt_lsb_minus4 + 4); // u(v)
            sps->used_by_curr_pic_lt_sps_flag[i] = bs_read_u1(b);
        }
    }

    sps->sps_temporal_mvp_enabled_flag = bs_read_u1(b);
    sps->strong_intra_smoothing_enabled_flag = bs_read_u1(b);
    sps->vui_parameters_present_flag = bs_read_u1(b);
    if (sps->vui_parameters_present_flag)
    {
        h265_read_vui_parameters(&(sps->vui), b, sps->sps_max_sub_layers_minus1);
        // calc fps
        if (sps->vui.vui_num_units_in_tick != 0)
            h->info->max_framerate = (float)(sps->vui.vui_time_scale) / (float)(sps->vui.vui_num_units_in_tick);
    }

    sps->sps_extension_present_flag = bs_read_u1(b);
    if (sps->sps_extension_present_flag)
    {
        sps->sps_range_extension_flag      = bs_read_u1(b);
        sps->sps_multilayer_extension_flag = bs_read_u1(b);
        sps->sps_3d_extension_flag         = bs_read_u1(b);
        sps->sps_extension_5bits           = bs_read_u(b, 5);
    }

    if (sps->sps_range_extension_flag)
    {
        sps->sps_range_extension.transform_skip_rotation_enabled_flag    = bs_read_u1(b);
        sps->sps_range_extension.transform_skip_context_enabled_flag     = bs_read_u1(b);
        sps->sps_range_extension.implicit_rdpcm_enabled_flag             = bs_read_u1(b);
        sps->sps_range_extension.explicit_rdpcm_enabled_flag             = bs_read_u1(b);
        sps->sps_range_extension.extended_precision_processing_flag      = bs_read_u1(b);
        sps->sps_range_extension.intra_smoothing_disabled_flag           = bs_read_u1(b);
        sps->sps_range_extension.high_precision_offsets_enabled_flag     = bs_read_u1(b);
        sps->sps_range_extension.persistent_rice_adaptation_enabled_flag = bs_read_u1(b);
        sps->sps_range_extension.cabac_bypass_alignment_enabled_flag     = bs_read_u1(b);
    }
    if (sps->sps_multilayer_extension_flag)
    {
        // sps_multilayer_extension()
        sps->inter_view_mv_vert_constraint_flag = bs_read_u1(b);
    }
    if (sps->sps_3d_extension_flag)
    {
        // todo sps_3d_extension( )
    }
    if (sps->sps_extension_5bits)
    {
        while (h265_more_rbsp_trailing_data(b))
        {
            int sps_extension_data_flag = bs_read_u1(b);
        }
    }
    h265_read_rbsp_trailing_bits(b);
}